

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O1

bool __thiscall
CMenus::DoButton_GridHeader
          (CMenus *this,void *pID,char *pText,bool Checked,int Align,CUIRect *pRect,int Corners)

{
  bool bVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  CUIRect Label;
  vec4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,Checked) == 0) {
    if ((((this->super_CComponent).m_pClient)->m_UI).m_pHotItem == pID) {
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
      local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
      local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
      local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
      CUIRect::Draw(pRect,&local_48,5.0,Corners);
    }
  }
  else {
    local_48._0_8_ = 0x3f6666663f666666;
    local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f666666;
    local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
    CUIRect::Draw(pRect,&local_48,5.0,Corners);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0.0,0.0,0.0,1.0);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[5])
              (1.0,1.0,1.0,0.25);
  }
  CUIRect::VMargin(pRect,2.0,(CUIRect *)&local_48);
  CUI::DoLabel(&((this->super_CComponent).m_pClient)->m_UI,(CUIRect *)&local_48,pText,
               local_48.field_3.w * 0.8 * 0.8,Align | 4,-1.0,true);
  if (Checked) {
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (1.0,1.0,1.0,1.0);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[5])
              (0.0,0.0,0.0,0.3);
  }
  bVar1 = CUI::DoButtonLogic(&((this->super_CComponent).m_pClient)->m_UI,pID,pRect,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CMenus::DoButton_GridHeader(const void *pID, const char *pText, bool Checked, int Align, const CUIRect *pRect, int Corners)
{
	if(Checked)
	{
		pRect->Draw(vec4(0.9f, 0.9f, 0.9f, 0.5f), 5.0f, Corners);
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	else if(UI()->HotItem() == pID)
	{
		pRect->Draw(vec4(1.0f, 1.0f, 1.0f, 0.5f), 5.0f, Corners);
	}

	CUIRect Label;
	pRect->VMargin(2.0f, &Label);
	UI()->DoLabel(&Label, pText, Label.h*CUI::ms_FontmodHeight*0.8f, Align|TEXTALIGN_MIDDLE);

	if(Checked)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}

	return UI()->DoButtonLogic(pID, pRect);
}